

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  undefined1 uVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps_01;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  undefined4 *puVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  uint *puVar13;
  uint *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  undefined4 *puVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  undefined8 uVar20;
  undefined4 *puVar21;
  undefined8 in_stack_fffffffffffff900;
  int in_stack_fffffffffffff908;
  int iVar22;
  undefined4 in_stack_fffffffffffff90c;
  int *piVar23;
  undefined8 in_stack_fffffffffffff918;
  int *piVar24;
  undefined8 in_stack_fffffffffffff928;
  int32_t in_stack_fffffffffffff930;
  fpclass_type in_stack_fffffffffffff934;
  int *in_stack_fffffffffffff948;
  undefined8 in_stack_fffffffffffff950;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pCVar25;
  long in_stack_fffffffffffff958;
  undefined8 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff968 [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_620;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_520;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_420;
  uint local_3a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  undefined4 local_230 [28];
  undefined4 local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  uint local_1b0 [28];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  undefined4 local_130 [28];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar19 = 0;
  lVar6 = 0x1c;
  puVar13 = (uint *)eps;
  puVar14 = local_b0;
  for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar14 = *puVar13;
    puVar13 = puVar13 + 1;
    puVar14 = puVar14 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  puVar21 = local_130;
  puVar11 = (undefined4 *)eps2.m_backend.data._M_elems._0_8_;
  puVar16 = puVar21;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar16 = *puVar11;
    puVar11 = puVar11 + 1;
    puVar16 = puVar16 + 1;
  }
  local_c0 = *(undefined4 *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
  local_bc = *(undefined1 *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
  local_b8 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
  eps2_00.m_backend.data._M_elems._8_8_ = in_stack_fffffffffffff900;
  eps2_00.m_backend.data._M_elems._0_8_ = puVar21;
  eps2_00.m_backend.data._M_elems[4] = in_stack_fffffffffffff908;
  eps2_00.m_backend.data._M_elems[5] = in_stack_fffffffffffff90c;
  eps2_00.m_backend.data._M_elems._24_8_ = ridx;
  eps2_00.m_backend.data._M_elems._32_8_ = in_stack_fffffffffffff918;
  eps2_00.m_backend.data._M_elems._40_8_ = rhs;
  eps2_00.m_backend.data._M_elems._48_8_ = in_stack_fffffffffffff928;
  eps2_00.m_backend.data._M_elems[0xe] = in_stack_fffffffffffff930;
  eps2_00.m_backend.data._M_elems[0xf] = in_stack_fffffffffffff934;
  eps2_00.m_backend.data._M_elems._64_8_ = vec;
  eps2_00.m_backend.data._M_elems._72_8_ = idx;
  eps2_00.m_backend.data._M_elems._80_8_ = in_stack_fffffffffffff948;
  eps2_00.m_backend.data._M_elems._88_8_ = in_stack_fffffffffffff950;
  eps2_00.m_backend.data._M_elems._96_8_ = in_stack_fffffffffffff958;
  eps2_00.m_backend.data._M_elems._104_8_ = in_stack_fffffffffffff960;
  eps2_00.m_backend._112_16_ = in_stack_fffffffffffff968;
  uVar20 = eps2.m_backend.data._M_elems._40_8_;
  vSolveLright2(this,rhs,ridx,rn,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_b0,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend.data._M_elems._40_8_,eps2_00);
  piVar24 = (this->row).perm;
  iVar22 = 0;
  piVar23 = ridx;
  if (eps2.m_backend.data._M_elems._48_8_ == 0) {
    pnVar12 = eps;
    for (lVar6 = 0; lVar6 < *rn; lVar6 = lVar6 + 1) {
      iVar4 = ridx[lVar6];
      pcVar10 = &rhs[iVar4].m_backend;
      iVar2 = rhs[iVar4].m_backend.exp;
      bVar3 = rhs[iVar4].m_backend.neg;
      lVar5 = 0x1c;
      pcVar8 = pcVar10;
      pnVar9 = &local_4a0;
      for (lVar7 = lVar5; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_4a0.m_backend.fpclass = rhs[iVar4].m_backend.fpclass;
      local_4a0.m_backend.prec_elem = rhs[iVar4].m_backend.prec_elem;
      pnVar9 = eps;
      pnVar15 = &local_520;
      local_4a0.m_backend.exp = iVar2;
      local_4a0.m_backend.neg = bVar3;
      for (; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_520.m_backend.exp = (eps->m_backend).exp;
      local_520.m_backend.neg = (eps->m_backend).neg;
      local_520.m_backend.fpclass = (eps->m_backend).fpclass;
      local_520.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_4a0,&local_520);
      if (bVar3) {
        enQueueMax(ridx,(int *)&stack0xfffffffffffff908,piVar24[iVar4]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar10,0);
      }
    }
    *rn = iVar22;
    eps2.m_backend.data._M_elems._64_8_ = in_stack_fffffffffffff948;
  }
  else {
    lVar6 = 0x1c;
    lVar5 = 0;
    while (lVar5 < *rn) {
      iVar4 = ridx[lVar5];
      lVar18 = (long)iVar4;
      lVar17 = lVar18 * 0x80;
      pcVar10 = &rhs[lVar18].m_backend;
      pcVar8 = pcVar10;
      puVar13 = local_3a0;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar13 = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      }
      iVar2 = rhs[lVar18].m_backend.exp;
      bVar3 = rhs[lVar18].m_backend.neg;
      in_stack_fffffffffffff934 = rhs[lVar18].m_backend.fpclass;
      in_stack_fffffffffffff930 = rhs[lVar18].m_backend.prec_elem;
      pcVar8 = pcVar10;
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&stack0xfffffffffffff960;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar12->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + (ulong)bVar19 * -8 + 4);
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      in_stack_fffffffffffff90c = CONCAT13(bVar3,(int3)in_stack_fffffffffffff90c);
      pnVar12 = eps;
      pnVar9 = &local_420;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar9->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
      }
      local_420.m_backend.exp = (eps->m_backend).exp;
      local_420.m_backend.neg = (eps->m_backend).neg;
      local_420.m_backend.fpclass = (eps->m_backend).fpclass;
      local_420.m_backend.prec_elem = (eps->m_backend).prec_elem;
      ridx = piVar23;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&stack0xfffffffffffff960,&local_420);
      if (bVar3) {
        *(int *)eps2.m_backend.data._M_elems._64_8_ = iVar4;
        eps2.m_backend.data._M_elems._64_8_ = eps2.m_backend.data._M_elems._64_8_ + 4;
        piVar23 = ridx;
        enQueueMax(ridx,(int *)&stack0xfffffffffffff908,piVar24[lVar18]);
        puVar13 = local_3a0;
        puVar14 = (uint *)(eps2.m_backend.data._M_elems._48_8_ + lVar17);
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar14 = *puVar13;
          puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
          puVar14 = puVar14 + (ulong)bVar19 * -2 + 1;
        }
        *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x70 + lVar17) = iVar2;
        *(char *)(eps2.m_backend.data._M_elems._48_8_ + 0x74 + lVar17) =
             (char)((uint)in_stack_fffffffffffff90c >> 0x18);
        *(fpclass_type *)(eps2.m_backend.data._M_elems._48_8_ + 0x78 + lVar17) =
             in_stack_fffffffffffff934;
        *(int32_t *)(eps2.m_backend.data._M_elems._48_8_ + 0x7c + lVar17) =
             in_stack_fffffffffffff930;
        in_stack_fffffffffffff958 = lVar5;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar10,0);
        piVar23 = ridx;
        in_stack_fffffffffffff958 = lVar5;
      }
      lVar5 = in_stack_fffffffffffff958 + 1;
    }
    *rn = iVar22;
    *(int *)eps2.m_backend.data._M_elems._56_8_ = iVar22;
    pnVar12 = eps;
  }
  iVar22 = 0;
  for (lVar6 = 0; lVar6 < *(int *)eps2.m_backend.data._M_elems._40_8_; lVar6 = lVar6 + 1) {
    lVar18 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar6 * 4);
    lVar17 = lVar18 * 0x80;
    iVar4 = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x70 + lVar17);
    uVar1 = *(undefined1 *)(eps2.m_backend.data._M_elems._24_8_ + 0x74 + lVar17);
    lVar5 = 0x1c;
    pcVar10 = (cpp_dec_float<200U,_int,_void> *)(eps2.m_backend.data._M_elems._24_8_ + lVar17);
    pnVar9 = &local_5a0;
    for (lVar7 = lVar5; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pcVar10->data)._M_elems[0];
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar19 * -8 + 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_5a0.m_backend._120_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x78 + lVar17);
    puVar13 = (uint *)eps2.m_backend.data._M_elems._0_8_;
    pnVar9 = &local_620;
    local_5a0.m_backend.exp = iVar4;
    local_5a0.m_backend.neg = (bool)uVar1;
    for (; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = *puVar13;
      puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_620.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
    local_620.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
    local_620.m_backend._120_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
    bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_5a0,&local_620);
    if (bVar3) {
      enQueueMax((int *)eps2.m_backend.data._M_elems._32_8_,(int *)&stack0xfffffffffffff908,
                 piVar24[lVar18]);
      eps = pnVar12;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)(eps2.m_backend.data._M_elems._24_8_ + lVar17),0)
      ;
      eps = pnVar12;
    }
    pnVar12 = eps;
  }
  *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar22;
  iVar4 = *rn;
  lVar6 = 0x1c;
  pnVar9 = eps;
  puVar13 = local_1b0;
  for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar13 = (pnVar9->m_backend).data._M_elems[0];
    pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
    puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
  }
  local_140 = (eps->m_backend).exp;
  local_13c = (eps->m_backend).neg;
  local_138._0_4_ = (eps->m_backend).fpclass;
  local_138._4_4_ = (eps->m_backend).prec_elem;
  eps_00.m_backend.data._M_elems[2] = (uint)uVar20;
  eps_00.m_backend.data._M_elems[3] = SUB84(uVar20,4);
  eps_00.m_backend.data._M_elems._0_8_ = local_1b0;
  eps_00.m_backend.data._M_elems._16_8_ = puVar21;
  eps_00.m_backend.data._M_elems[6] = (int)in_stack_fffffffffffff900;
  eps_00.m_backend.data._M_elems[7] = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  eps_00.m_backend.data._M_elems[8] = iVar22;
  eps_00.m_backend.data._M_elems[9] = in_stack_fffffffffffff90c;
  eps_00.m_backend.data._M_elems._40_8_ = piVar23;
  eps_00.m_backend.data._M_elems._48_8_ = piVar24;
  eps_00.m_backend.data._M_elems._56_8_ = rhs;
  eps_00.m_backend.data._M_elems._64_8_ = pnVar12;
  eps_00.m_backend.data._M_elems[0x12] = in_stack_fffffffffffff930;
  eps_00.m_backend.data._M_elems[0x13] = in_stack_fffffffffffff934;
  eps_00.m_backend.data._M_elems._80_8_ = vec;
  eps_00.m_backend.data._M_elems._88_8_ = idx;
  eps_00.m_backend.data._M_elems._96_8_ = eps2.m_backend.data._M_elems._64_8_;
  eps_00.m_backend.data._M_elems._104_8_ = this;
  eps_00.m_backend.exp = (int)in_stack_fffffffffffff958;
  eps_00.m_backend.neg = (bool)(char)((ulong)in_stack_fffffffffffff958 >> 0x20);
  eps_00.m_backend._117_3_ = (int3)((ulong)in_stack_fffffffffffff958 >> 0x28);
  eps_00.m_backend.fpclass = (uint)in_stack_fffffffffffff960;
  eps_00.m_backend.prec_elem = SUB84(in_stack_fffffffffffff960,4);
  pCVar25 = this;
  iVar4 = vSolveUright(this,vec,idx,rhs,piVar23,iVar4,eps_00);
  *rn = iVar4;
  iVar4 = *(int *)eps2.m_backend.data._M_elems._40_8_;
  puVar11 = (undefined4 *)eps2.m_backend.data._M_elems._0_8_;
  puVar16 = local_230;
  for (; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar16 = *puVar11;
    puVar11 = puVar11 + (ulong)bVar19 * -2 + 1;
    puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
  }
  local_1c0 = *(undefined4 *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
  local_1bc = *(undefined1 *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
  local_1b8 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
  eps_01.m_backend.data._M_elems[2] = (uint)uVar20;
  eps_01.m_backend.data._M_elems[3] = SUB84(uVar20,4);
  eps_01.m_backend.data._M_elems._0_8_ = local_230;
  eps_01.m_backend.data._M_elems._16_8_ = puVar21;
  eps_01.m_backend.data._M_elems[6] = (int)in_stack_fffffffffffff900;
  eps_01.m_backend.data._M_elems[7] = (int)((ulong)in_stack_fffffffffffff900 >> 0x20);
  eps_01.m_backend.data._M_elems[8] = iVar22;
  eps_01.m_backend.data._M_elems[9] = in_stack_fffffffffffff90c;
  eps_01.m_backend.data._M_elems._40_8_ = piVar23;
  eps_01.m_backend.data._M_elems._48_8_ = piVar24;
  eps_01.m_backend.data._M_elems._56_8_ = rhs;
  eps_01.m_backend.data._M_elems._64_8_ = pnVar12;
  eps_01.m_backend.data._M_elems[0x12] = in_stack_fffffffffffff930;
  eps_01.m_backend.data._M_elems[0x13] = in_stack_fffffffffffff934;
  eps_01.m_backend.data._M_elems._80_8_ = vec;
  eps_01.m_backend.data._M_elems._88_8_ = idx;
  eps_01.m_backend.data._M_elems._96_8_ = eps2.m_backend.data._M_elems._64_8_;
  eps_01.m_backend.data._M_elems._104_8_ = pCVar25;
  eps_01.m_backend.exp = (int)in_stack_fffffffffffff958;
  eps_01.m_backend.neg = (bool)(char)((ulong)in_stack_fffffffffffff958 >> 0x20);
  eps_01.m_backend._117_3_ = (int3)((ulong)in_stack_fffffffffffff958 >> 0x28);
  eps_01.m_backend.fpclass = (uint)in_stack_fffffffffffff960;
  eps_01.m_backend.prec_elem = SUB84(in_stack_fffffffffffff960,4);
  iVar22 = vSolveUright(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)eps2.m_backend.data._M_elems._8_8_,
                        (int *)eps2.m_backend.data._M_elems._16_8_,
                        (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)eps2.m_backend.data._M_elems._24_8_,
                        (int *)eps2.m_backend.data._M_elems._32_8_,iVar4,eps_01);
  *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar22;
  if ((this->l).updateType == 0) {
    iVar22 = *rn;
    lVar6 = 0x1c;
    pnVar12 = eps;
    pnVar9 = &local_2b0;
    for (lVar5 = lVar6; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar9->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (eps->m_backend).exp;
    local_2b0.m_backend.neg = (eps->m_backend).neg;
    local_2b0.m_backend.fpclass = (eps->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar22 = vSolveUpdateRight(this,vec,idx,iVar22,&local_2b0);
    *rn = iVar22;
    iVar22 = *(int *)eps2.m_backend.data._M_elems._40_8_;
    puVar13 = (uint *)eps2.m_backend.data._M_elems._0_8_;
    pnVar12 = &local_330;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = *puVar13;
      puVar13 = puVar13 + (ulong)bVar19 * -2 + 1;
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
    local_330.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
    local_330.m_backend._120_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
    iVar22 = vSolveUpdateRight(this,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)eps2.m_backend.data._M_elems._8_8_,
                               (int *)eps2.m_backend.data._M_elems._16_8_,iVar22,&local_330);
    *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar22;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}